

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkFinMiterCollect_rec(Abc_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int Fill;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  pVVar4 = &pObj->pNtk->vTravIds;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(pVVar4,iVar1 + 1,(int)vNodes);
  iVar2 = Vec_IntEntry(pVVar4,iVar1);
  iVar1 = pObj->pNtk->nTravIds;
  if (iVar2 == iVar1) {
    return;
  }
  pVVar4 = &pObj->pNtk->vTravIds;
  iVar2 = pObj->Id;
  Vec_IntFillExtra(pVVar4,iVar2 + 1,Fill);
  Vec_IntWriteEntry(pVVar4,iVar2,iVar1);
  uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
  pVVar4 = vCis;
  if ((uVar3 != 2) && (uVar3 != 5)) {
    if (uVar3 != 7) {
      __assert_fail("Abc_ObjIsNode( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                    ,0x1f7,"void Abc_NtkFinMiterCollect_rec(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)")
      ;
    }
    for (lVar5 = 0; pVVar4 = vNodes, lVar5 < (pObj->vFanins).nSize; lVar5 = lVar5 + 1) {
      Abc_NtkFinMiterCollect_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]],vCis,vNodes);
    }
  }
  Vec_IntPush(pVVar4,pObj->Id);
  return;
}

Assistant:

void Abc_NtkFinMiterCollect_rec( Abc_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Abc_ObjIsCi(pObj) )
        Vec_IntPush( vCis, Abc_ObjId(pObj) );
    else
    {
        Abc_Obj_t * pFanin; int i;
        assert( Abc_ObjIsNode( pObj ) );
        Abc_ObjForEachFanin( pObj, pFanin, i )
            Abc_NtkFinMiterCollect_rec( pFanin, vCis, vNodes );
        Vec_IntPush( vNodes, Abc_ObjId(pObj) );
    }
}